

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O1

void skiwi::anon_unknown_2::inline_vector_length(PrimitiveCall *p,Expression *e)

{
  bool safe_primitives;
  byte bVar1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = (anonymous_namespace)::g_standard_bindings;
  safe_primitives = (bool)(anonymous_namespace)::g_safe_primitives;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"vector-length","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"##vector-length","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"##vector?","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  make_inline_procedure
            (p,e,1,(bool)(bVar1 ^ 1),safe_primitives,&local_90,&local_b0,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void inline_vector_length(PrimitiveCall& p, Expression& e)
    {
    make_inline_procedure(p, e, 1, !g_standard_bindings, g_safe_primitives, "vector-length", "##vector-length", "##vector?");
    }